

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O0

ssize_t __thiscall
xmrig::Threads<xmrig::CpuThreads>::read
          (Threads<xmrig::CpuThreads> *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  MemberIterator MVar2;
  CpuThreads *this_00;
  Reference pVVar3;
  size_type sVar4;
  undefined4 in_register_00000034;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *member_1;
  MemberIterator __end1_1;
  MemberIterator __begin1_1;
  ConstObject *__range1_1;
  CpuThreads threads;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *member;
  MemberIterator __end1;
  MemberIterator __begin1;
  ConstObject *__range1;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  CpuThreads *in_stack_ffffffffffffff68;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  in_stack_ffffffffffffff70;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  in_stack_ffffffffffffff78;
  Value *in_stack_ffffffffffffffa8;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_20;
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *local_18;
  undefined8 local_10;
  Threads<xmrig::CpuThreads> *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_fffffffffffffeef,
                        CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
  local_18 = &local_20;
  local_28.ptr_ =
       (Pointer)rapidjson::
                GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                ::begin((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                         *)CONCAT17(in_stack_fffffffffffffeef,
                                    CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
  MVar2 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::end((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                 *)CONCAT17(in_stack_fffffffffffffeef,
                            CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
  while (bVar1 = rapidjson::
                 GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator!=(&local_28,(ConstIterator)MVar2.ptr_), bVar1) {
    this_00 = (CpuThreads *)
              rapidjson::
              GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::operator*(&local_28);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&this_00->m_data);
    if ((bVar1) ||
       (bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&this_00->m_data), bVar1)) {
      CpuThreads::CpuThreads(this_00,in_stack_ffffffffffffffa8);
      bVar1 = CpuThreads::isEmpty((CpuThreads *)0x1f350b);
      if (!bVar1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)this_00);
        move((Threads<xmrig::CpuThreads> *)in_stack_ffffffffffffff78.value_,
             (char *)in_stack_ffffffffffffff70.ptr_,in_stack_ffffffffffffff68);
      }
      CpuThreads::~CpuThreads((CpuThreads *)0x1f357a);
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++(&local_28);
  }
  rapidjson::
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~GenericObject(&local_20);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_fffffffffffffeef,
                        CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
  rapidjson::
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::begin((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
           *)CONCAT17(in_stack_fffffffffffffeef,
                      CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
  MVar2 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::end((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                 *)CONCAT17(in_stack_fffffffffffffeef,
                            CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
  while (bVar1 = rapidjson::
                 GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator!=((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)&stack0xffffffffffffff70,(ConstIterator)MVar2.ptr_), bVar1) {
    pVVar3 = rapidjson::
             GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator*((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&stack0xffffffffffffff70);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(&pVVar3->value);
    if (!bVar1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::IsObject(&pVVar3->value);
    }
    rapidjson::
    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
    ::operator++((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&stack0xffffffffffffff70);
  }
  rapidjson::
  GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~GenericObject((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                    *)&stack0xffffffffffffff78);
  sVar4 = std::
          map<xmrig::String,_xmrig::CpuThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
          ::size((map<xmrig::String,_xmrig::CpuThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
                  *)0x1f36ee);
  return sVar4;
}

Assistant:

size_t xmrig::Threads<T>::read(const rapidjson::Value &value)
{
    using namespace rapidjson;

    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            T threads(member.value);

            if (!threads.isEmpty()) {
                move(member.name.GetString(), std::move(threads));
            }
        }
    }
    for (auto &member : value.GetObject()) {
        if (member.value.IsArray() || member.value.IsObject()) {
            continue;
        }
    }

    return m_profiles.size();
}